

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O0

void __thiscall
RegisterSubprocessTestInterruptChild::RegisterSubprocessTestInterruptChild
          (RegisterSubprocessTestInterruptChild *this)

{
  RegisterSubprocessTestInterruptChild *this_local;
  
  RegisterTest(SubprocessTestInterruptChild::Create,"SubprocessTest.InterruptChild");
  return;
}

Assistant:

TEST_F(SubprocessTest, InterruptChild) {
  Subprocess* subproc = subprocs_.Add("kill -INT $$");
  ASSERT_NE((Subprocess *) 0, subproc);

  subprocs_.ResetTokenAvailable();
  while (!subproc->Done()) {
    subprocs_.DoWork(NULL);
  }
  ASSERT_FALSE(subprocs_.IsTokenAvailable());

  EXPECT_EQ(ExitInterrupted, subproc->Finish());
}